

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O1

array<pbrt::Point3<float>,_4> * __thiscall
pbrt::CubicBezierControlPoints<pbrt::Point3<float>>
          (array<pbrt::Point3<float>,_4> *__return_storage_ptr__,pbrt *this,
          span<const_pbrt::Point3<float>_> cp,Float uMin,Float uMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar29;
  float fVar30;
  float fVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  fVar1 = *(float *)(this + 8);
  fVar2 = *(float *)(this + 0x14);
  fVar3 = *(float *)(this + 0x20);
  fVar4 = *(float *)(this + 0x2c);
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&__return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.z = 0;
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&__return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.z = 0;
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  fVar15 = 1.0 - uMax;
  fVar9 = fVar15 * fVar2 + fVar3 * uMax;
  fVar16 = 1.0 - uMin;
  fVar10 = fVar2 * uMin + fVar16 * fVar1;
  fVar11 = fVar3 * uMin + fVar16 * fVar2;
  fVar12 = fVar16 * fVar3 + fVar4 * uMin;
  fVar13 = fVar11 * uMin + fVar10 * fVar16;
  fVar14 = fVar16 * fVar11 + fVar12 * uMin;
  uVar5 = *(ulong *)(this + 0xc);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar5;
  uVar6 = *(ulong *)(this + 0x18);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar6;
  uVar7 = *(ulong *)(this + 0x24);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar7;
  auVar20._4_4_ = fVar15;
  auVar20._0_4_ = fVar15;
  auVar20._8_4_ = fVar15;
  auVar20._12_4_ = fVar15;
  fVar24 = (float)*(undefined8 *)this;
  fVar27 = (float)((ulong)*(undefined8 *)this >> 0x20);
  auVar21._4_4_ = uMax;
  auVar21._0_4_ = uMax;
  auVar21._8_4_ = uMax;
  auVar21._12_4_ = uMax;
  fVar28 = (float)uVar5;
  fVar29 = (float)(uVar5 >> 0x20);
  fVar30 = (float)uVar6;
  fVar33 = (float)(uVar6 >> 0x20);
  fVar37 = fVar15 * fVar28 + fVar30 * uMax;
  fVar38 = fVar15 * fVar29 + fVar33 * uMax;
  fVar39 = fVar15 * 0.0 + uMax * 0.0;
  fVar40 = fVar15 * 0.0 + uMax * 0.0;
  auVar41._0_4_ = fVar15 * fVar30;
  auVar41._4_4_ = fVar15 * fVar33;
  auVar41._8_4_ = fVar15 * 0.0;
  auVar41._12_4_ = fVar15 * 0.0;
  auVar17 = vmulps_avx512vl(auVar17,auVar21);
  auVar17 = vaddps_avx512vl(auVar41,auVar17);
  auVar36._0_4_ =
       fVar15 * (fVar15 * (fVar15 * fVar24 + fVar28 * uMax) + fVar37 * uMax) +
       (fVar15 * fVar37 + auVar17._0_4_ * uMax) * uMax;
  auVar36._4_4_ =
       fVar15 * (fVar15 * (fVar15 * fVar27 + fVar29 * uMax) + fVar38 * uMax) +
       (fVar15 * fVar38 + auVar17._4_4_ * uMax) * uMax;
  auVar36._8_4_ =
       fVar15 * (fVar15 * (fVar15 * 0.0 + uMax * 0.0) + fVar39 * uMax) +
       (fVar15 * fVar39 + auVar17._8_4_ * uMax) * uMax;
  auVar36._12_4_ =
       fVar15 * (fVar15 * (fVar15 * 0.0 + uMax * 0.0) + fVar40 * uMax) +
       (fVar15 * fVar40 + auVar17._12_4_ * uMax) * uMax;
  auVar19._0_4_ = fVar16 * fVar24;
  auVar19._4_4_ = fVar16 * fVar27;
  auVar19._8_4_ = fVar16 * 0.0;
  auVar19._12_4_ = fVar16 * 0.0;
  auVar42._4_4_ = uMin;
  auVar42._0_4_ = uMin;
  auVar42._8_4_ = uMin;
  auVar42._12_4_ = uMin;
  auVar17 = vmulps_avx512vl(auVar25,auVar42);
  auVar17 = vaddps_avx512vl(auVar19,auVar17);
  auVar26._0_4_ = fVar16 * fVar28;
  auVar26._4_4_ = fVar16 * fVar29;
  auVar26._8_4_ = fVar16 * 0.0;
  auVar26._12_4_ = fVar16 * 0.0;
  auVar18 = vmulps_avx512vl(auVar31,auVar42);
  auVar18 = vaddps_avx512vl(auVar26,auVar18);
  auVar32._0_4_ = fVar16 * fVar30 + (float)uVar7 * uMin;
  auVar32._4_4_ = fVar16 * fVar33 + (float)(uVar7 >> 0x20) * uMin;
  auVar32._8_4_ = fVar16 * 0.0 + uMin * 0.0;
  auVar32._12_4_ = fVar16 * 0.0 + uMin * 0.0;
  auVar34._0_4_ = fVar15 * auVar17._0_4_;
  auVar34._4_4_ = fVar15 * auVar17._4_4_;
  auVar34._8_4_ = fVar15 * auVar17._8_4_;
  auVar34._12_4_ = fVar15 * auVar17._12_4_;
  auVar19 = vmulps_avx512vl(auVar18,auVar21);
  auVar19 = vaddps_avx512vl(auVar34,auVar19);
  auVar35._0_4_ = fVar15 * auVar19._0_4_;
  auVar35._4_4_ = fVar15 * auVar19._4_4_;
  auVar35._8_4_ = fVar15 * auVar19._8_4_;
  auVar35._12_4_ = fVar15 * auVar19._12_4_;
  auVar19 = vmulps_avx512vl(auVar20,auVar18);
  auVar20 = vmulps_avx512vl(auVar32,auVar21);
  auVar19 = vaddps_avx512vl(auVar19,auVar20);
  auVar19 = vmulps_avx512vl(auVar19,auVar21);
  auVar19 = vaddps_avx512vl(auVar35,auVar19);
  auVar23._0_4_ = fVar16 * auVar17._0_4_;
  auVar23._4_4_ = fVar16 * auVar17._4_4_;
  auVar23._8_4_ = fVar16 * auVar17._8_4_;
  auVar23._12_4_ = fVar16 * auVar17._12_4_;
  auVar17 = vmulps_avx512vl(auVar18,auVar42);
  auVar17 = vaddps_avx512vl(auVar23,auVar17);
  fVar24 = fVar16 * auVar18._0_4_ + auVar32._0_4_ * uMin;
  fVar27 = fVar16 * auVar18._4_4_ + auVar32._4_4_ * uMin;
  fVar28 = fVar16 * auVar18._8_4_ + auVar32._8_4_ * uMin;
  fVar29 = fVar16 * auVar18._12_4_ + auVar32._12_4_ * uMin;
  auVar18._0_4_ = fVar15 * auVar17._0_4_ + fVar24 * uMax;
  auVar18._4_4_ = fVar15 * auVar17._4_4_ + fVar27 * uMax;
  auVar18._8_4_ = fVar15 * auVar17._8_4_ + fVar28 * uMax;
  auVar18._12_4_ = fVar15 * auVar17._12_4_ + fVar29 * uMax;
  auVar22._0_4_ = fVar16 * auVar17._0_4_ + fVar24 * uMin;
  auVar22._4_4_ = fVar16 * auVar17._4_4_ + fVar27 * uMin;
  auVar22._8_4_ = fVar16 * auVar17._8_4_ + fVar28 * uMin;
  auVar22._12_4_ = fVar16 * auVar17._12_4_ + fVar29 * uMin;
  uVar8 = vmovlps_avx(auVar22);
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  __return_storage_ptr__->values[0].super_Tuple3<pbrt::Point3,_float>.z =
       fVar16 * fVar13 + fVar14 * uMin;
  uVar8 = vmovlps_avx(auVar18);
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  __return_storage_ptr__->values[1].super_Tuple3<pbrt::Point3,_float>.z =
       fVar15 * fVar13 + fVar14 * uMax;
  uVar8 = vmovlps_avx(auVar19);
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  __return_storage_ptr__->values[2].super_Tuple3<pbrt::Point3,_float>.z =
       fVar15 * (fVar11 * uMax + fVar15 * fVar10) + (fVar15 * fVar11 + fVar12 * uMax) * uMax;
  uVar8 = vmovlps_avx(auVar36);
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  __return_storage_ptr__->values[3].super_Tuple3<pbrt::Point3,_float>.z =
       (fVar15 * fVar9 + (fVar15 * fVar3 + fVar4 * uMax) * uMax) * uMax +
       fVar15 * (fVar9 * uMax + fVar15 * (fVar2 * uMax + fVar15 * fVar1));
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<P, 4> CubicBezierControlPoints(pstd::span<const P> cp,
                                                               Float uMin, Float uMax) {
    return {BlossomCubicBezier(cp, uMin, uMin, uMin),
            BlossomCubicBezier(cp, uMin, uMin, uMax),
            BlossomCubicBezier(cp, uMin, uMax, uMax),
            BlossomCubicBezier(cp, uMax, uMax, uMax)};
}